

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json_test.cpp
# Opt level: O2

void __thiscall
PersistentStorageJsonTestSuite_UpdNetwork_Test::~PersistentStorageJsonTestSuite_UpdNetwork_Test
          (PersistentStorageJsonTestSuite_UpdNetwork_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(PersistentStorageJsonTestSuite, UpdNetwork)
{
    unlink("./tmp/tmp.json");
    PersistentStorageJson psj("./tmp/tmp.json");

    EXPECT_TRUE(psj.Open() == PersistentStorage::Status::kSuccess);

    Network nwk{EMPTY_ID, EMPTY_ID, "nwk", 0xFFFFFFFFFFFFFFFA, 17, 0xFFFA, "2000:aaa1::0/64", 0};

    EXPECT_TRUE(psj.Update(nwk) == PersistentStorage::Status::kNotFound);
    NetworkId nid;
    EXPECT_TRUE(psj.Add(nwk, nid) == PersistentStorage::Status::kSuccess);
    nwk.mId      = nid;
    nwk.mChannel = 18;
    nwk.mName    = "nwk_upd";
    EXPECT_TRUE(psj.Update(nwk) == PersistentStorage::Status::kSuccess);

    Network returnValue;

    EXPECT_TRUE(psj.Get(NetworkId(0), returnValue) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(returnValue.mId.mId == 0);
    EXPECT_TRUE(returnValue.mName == "nwk_upd");
    EXPECT_TRUE(returnValue.mChannel == 18);

    EXPECT_TRUE(psj.Close() == PersistentStorage::Status::kSuccess);
}